

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void DoIt(int maxDamageBinIdx,char *binFileName,char *idxFileName,bool useIndexFile,bool zip,
         bool validationCheck,bool allIntensityBinsCheck)

{
  Validate *this;
  VulnerabilityToBin vTB;
  VulnerabilityToBin local_3118;
  
  VulnerabilityToBin::VulnerabilityToBin
            (&local_3118,maxDamageBinIdx,binFileName,idxFileName,useIndexFile,zip,
             allIntensityBinsCheck);
  this = &local_3118.super_ValidateVulnerability.super_Validate;
  Validate::SkipHeaderRow(this);
  VulnerabilityToBin::WriteHeader(&local_3118);
  if (validationCheck) {
    ValidateVulnerability::ReadVulnerabilityFile(&local_3118.super_ValidateVulnerability);
    Validate::PrintSuccessMessage(this);
  }
  else {
    VulnerabilityToBin::ReadVulnerabilityFileNoChecks(&local_3118);
  }
  VulnerabilityToBin::~VulnerabilityToBin(&local_3118);
  return;
}

Assistant:

void DoIt(const int maxDamageBinIdx, const char* binFileName,
	  const char* idxFileName, const bool useIndexFile, const bool zip,
	  const bool validationCheck, const bool allIntensityBinsCheck) {

  VulnerabilityToBin vTB(maxDamageBinIdx, binFileName, idxFileName,
			 useIndexFile, zip, allIntensityBinsCheck);
  vTB.SkipHeaderRow();
  vTB.WriteHeader();

  if (validationCheck) {

    vTB.ReadVulnerabilityFile();
    vTB.PrintSuccessMessage();

    return;

  }

  vTB.ReadVulnerabilityFileNoChecks();

}